

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::RestorePathDependentInfo
          (GlobOpt *this,PathDependentInfo *info,PathDependentInfoToRestore infoToRestore)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  
  if (info == (PathDependentInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x291e,"(info)","info");
    if (!bVar2) goto LAB_00469f24;
    *puVar3 = 0;
  }
  if (infoToRestore.leftValueInfo != (ValueInfo *)0x0) {
    pVVar4 = PathDependentInfo::LeftValue(info);
    if (pVVar4 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2922,"(info->LeftValue())","info->LeftValue()");
      if (!bVar2) goto LAB_00469f24;
      *puVar3 = 0;
    }
    pVVar4 = PathDependentInfo::LeftValue(info);
    ChangeValueInfo(this,(BasicBlock *)0x0,pVVar4,infoToRestore.leftValueInfo,false,false);
  }
  if (infoToRestore.rightValueInfo == (ValueInfo *)0x0) {
    return;
  }
  pVVar4 = PathDependentInfo::RightValue(info);
  if (pVVar4 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2928,"(info->RightValue())","info->RightValue()");
    if (!bVar2) {
LAB_00469f24:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pVVar4 = PathDependentInfo::RightValue(info);
  ChangeValueInfo(this,(BasicBlock *)0x0,pVVar4,infoToRestore.rightValueInfo,false,false);
  return;
}

Assistant:

void
GlobOpt::RestorePathDependentInfo(PathDependentInfo *const info, const PathDependentInfoToRestore infoToRestore)
{
    Assert(info);

    if(infoToRestore.LeftValueInfo())
    {
        Assert(info->LeftValue());
        ChangeValueInfo(nullptr, info->LeftValue(), infoToRestore.LeftValueInfo());
    }

    if(infoToRestore.RightValueInfo())
    {
        Assert(info->RightValue());
        ChangeValueInfo(nullptr, info->RightValue(), infoToRestore.RightValueInfo());
    }
}